

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

LY_ERR lyd_dup_ctx_check(lyd_node *node,lyd_node_inner *parent)

{
  lysc_node *plVar1;
  lysc_node *plVar2;
  lysc_node *plVar3;
  uint32_t *puVar4;
  lys_module *plVar5;
  lyd_node_inner *plVar6;
  LY_ERR LVar7;
  lys_module *plVar8;
  
  LVar7 = LY_SUCCESS;
  if (parent != (lyd_node_inner *)0x0) {
    plVar1 = node->schema;
    if (plVar1 == (lysc_node *)0x0) {
      plVar5 = (lys_module *)&node[2].schema;
    }
    else {
      plVar5 = plVar1->module;
    }
    plVar2 = (parent->field_0).node.schema;
    if (plVar2 == (lysc_node *)0x0) {
      plVar8 = (lys_module *)&parent[1].field_0.node.priv;
    }
    else {
      plVar8 = plVar2->module;
    }
    plVar6 = (lyd_node_inner *)node;
    if (plVar5->ctx != plVar8->ctx) {
      do {
        if (plVar6 == (lyd_node_inner *)0x0) goto LAB_00120dfc;
        puVar4 = (uint32_t *)&plVar6->field_0;
        plVar6 = *(lyd_node_inner **)((long)&plVar6->field_0 + 0x10);
      } while ((puVar4[1] & 8) == 0);
      if (plVar6 != (lyd_node_inner *)0x0) {
        plVar3 = (plVar6->field_0).node.schema;
        if (plVar3 == (lysc_node *)0x0) {
          plVar5 = (lys_module *)&plVar6[1].field_0.node.priv;
        }
        else {
          plVar5 = plVar3->module;
        }
        if (plVar2 == (lysc_node *)0x0) {
          plVar8 = (lys_module *)&parent[1].field_0.node.priv;
        }
        else {
          plVar8 = plVar2->module;
        }
        if (plVar5->ctx == plVar8->ctx) {
          return LY_SUCCESS;
        }
      }
LAB_00120dfc:
      if (plVar1 == (lysc_node *)0x0) {
        plVar5 = (lys_module *)&node[2].schema;
      }
      else {
        plVar5 = plVar1->module;
      }
      LVar7 = LY_EINVAL;
      ly_log(plVar5->ctx,LY_LLERR,LY_EINVAL,"Different contexts used in node duplication.");
    }
  }
  return LVar7;
}

Assistant:

static LY_ERR
lyd_dup_ctx_check(const struct lyd_node *node, const struct lyd_node_inner *parent)
{
    const struct lyd_node *iter;

    if (!node || !parent) {
        return LY_SUCCESS;
    }

    if ((LYD_CTX(node) != LYD_CTX(parent))) {
        /* try to find top-level ext data parent */
        for (iter = node; iter && !(iter->flags & LYD_EXT); iter = lyd_parent(iter)) {}

        if (!iter || !lyd_parent(iter) || (LYD_CTX(lyd_parent(iter)) != LYD_CTX(parent))) {
            LOGERR(LYD_CTX(node), LY_EINVAL, "Different contexts used in node duplication.");
            return LY_EINVAL;
        }
    }

    return LY_SUCCESS;
}